

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::setWinId(QWidgetPrivate *this,WId id)

{
  WId WVar1;
  QHash<unsigned_long_long,QWidget*> *this_00;
  long in_FS_OFFSET;
  QWidget *q;
  undefined1 *local_38;
  undefined1 *puStack_30;
  QWidget *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = *(QWidget **)&this->field_0x8;
  if (mapper == (QWidgetMapper *)0x0) {
    this_00 = (QHash<unsigned_long_long,QWidget*> *)0x0;
  }
  else {
    this_00 = (QHash<unsigned_long_long,QWidget*> *)mapper;
    if ((this->data).winid != 0) {
      QHash<unsigned_long_long,_QWidget_*>::removeImpl<unsigned_long_long>
                (mapper,&(this->data).winid);
      this_00 = (QHash<unsigned_long_long,QWidget*> *)mapper;
    }
  }
  WVar1 = (this->data).winid;
  (this->data).winid = id;
  if (id != 0 && this_00 != (QHash<unsigned_long_long,QWidget*> *)0x0) {
    QHash<unsigned_long_long,QWidget*>::emplace<QWidget*const&>
              (this_00,&(this->data).winid,&local_28);
  }
  if (WVar1 != id) {
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_38,WinIdChange);
    QCoreApplication::sendEvent(&local_28->super_QObject,(QEvent *)&local_38);
    QEvent::~QEvent((QEvent *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setWinId(WId id)                // set widget identifier
{
    Q_Q(QWidget);
    if (mapper && data.winid) {
        mapper->remove(data.winid);
    }

    const WId oldWinId = data.winid;

    data.winid = id;
    if (mapper && id) {
        mapper->insert(data.winid, q);
    }

    if (oldWinId != id) {
        QEvent e(QEvent::WinIdChange);
        QCoreApplication::sendEvent(q, &e);
    }
}